

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fReadPixelsTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::ReadPixelsTest::render(ReadPixelsTest *this,Texture2D *reference)

{
  RenderContext *renderCtx;
  GLenum GVar1;
  GLuint index;
  int iVar2;
  TestError *this_00;
  int iVar3;
  int x;
  int x_00;
  int y;
  int iVar4;
  float fVar5;
  float fVar6;
  allocator<char> local_222;
  allocator<char> local_221;
  int local_220;
  int local_21c;
  string local_218;
  string local_1f8;
  float coords [12];
  ShaderProgram program;
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,
             "attribute mediump vec2 a_coord;\nvoid main (void)\n{\n\tgl_Position = vec4(a_coord, 0.0, 1.0);\n}\n"
             ,&local_221);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,
             "void main (void)\n{\n\tgl_FragColor = vec4(0.0, 0.0, 0.0, 1.0);\n}\n",&local_222);
  glu::makeVtxFragSources((ProgramSources *)coords,&local_1f8,&local_218);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)coords);
  glu::ProgramSources::~ProgramSources((ProgramSources *)coords);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk != false) {
    glwUseProgram(program.m_program.m_program);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glUseProgram(program.getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                    ,0x61);
    coords[8] = -0.5;
    coords[9] = 0.5;
    coords[10] = -0.5;
    coords[0xb] = -0.5;
    coords._16_8_ = &DAT_3f0000003f000000;
    coords._24_8_ = &DAT_3f0000003f000000;
    coords[0] = -0.5;
    coords[1] = -0.5;
    coords[2] = 0.5;
    coords[3] = -0.5;
    index = glwGetAttribLocation(program.m_program.m_program,"a_coord");
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                    ,0x72);
    glwEnableVertexAttribArray(index);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glEnableVertexAttribArray(coordLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                    ,0x74);
    glwVertexAttribPointer(index,2,0x1406,'\0',0,coords);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                    ,0x76);
    glwDrawArrays(4,0,6);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glDrawArrays(GL_TRIANGLES, 0, 6)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                    ,0x78);
    glwDisableVertexAttribArray(index);
    GVar1 = glwGetError();
    glu::checkError(GVar1,"glDisableVertexAttribArray(coordLoc)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
                    ,0x79);
    iVar4 = reference->m_width;
    iVar2 = reference->m_height;
    fVar5 = (float)iVar4 * 0.5;
    iVar3 = (int)(fVar5 - fVar5 * 0.5);
    fVar6 = (float)iVar2 * 0.5;
    local_21c = (int)(fVar5 * 0.5 + fVar5);
    local_220 = iVar3;
    for (x_00 = 0; x_00 < iVar4; x_00 = x_00 + 1) {
      if ((iVar3 <= x_00) && (x_00 <= local_21c)) {
        for (iVar4 = 0; iVar4 < iVar2; iVar4 = iVar4 + 1) {
          if (((int)(fVar6 - fVar6 * 0.5) <= iVar4) && (iVar4 <= (int)(fVar6 * 0.5 + fVar6))) {
            coords[0] = 0.0;
            coords[1] = 0.0;
            coords[2] = 0.0;
            coords[3] = 1.0;
            tcu::PixelBufferAccess::setPixel
                      ((reference->super_TextureLevelPyramid).m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)coords,x_00,iVar4,0);
            iVar2 = reference->m_height;
          }
        }
        iVar4 = reference->m_width;
        iVar3 = local_220;
      }
    }
    glu::ShaderProgram::~ShaderProgram(&program);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fReadPixelsTests.cpp"
             ,0x60);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ReadPixelsTest::render (tcu::Texture2D& reference)
{
	// Create program
	const char* vertexSource =
	"attribute mediump vec2 a_coord;\n"
	"void main (void)\n"
	"{\n"
	"\tgl_Position = vec4(a_coord, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentSource =
	"void main (void)\n"
	"{\n"
	"\tgl_FragColor = vec4(0.0, 0.0, 0.0, 1.0);\n"
	"}\n";

	glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(vertexSource, fragmentSource));

	m_testCtx.getLog() << program;
	TCU_CHECK(program.isOk());
	GLU_CHECK_CALL(glUseProgram(program.getProgram()));

	// Render
	{
		const float coords[] =
		{
			-0.5f, -0.5f,
			 0.5f, -0.5f,
			 0.5f,  0.5f,

			 0.5f,  0.5f,
			-0.5f,  0.5f,
			-0.5f, -0.5f
		};
		GLuint coordLoc;

		coordLoc = glGetAttribLocation(program.getProgram(), "a_coord");
		GLU_CHECK_MSG("glGetAttribLocation()");

		GLU_CHECK_CALL(glEnableVertexAttribArray(coordLoc));

		GLU_CHECK_CALL(glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, coords));

		GLU_CHECK_CALL(glDrawArrays(GL_TRIANGLES, 0, 6));
		GLU_CHECK_CALL(glDisableVertexAttribArray(coordLoc));
	}

	// Render reference

	const int coordX1 = (int)((-0.5f * (float)reference.getWidth()	/ 2.0f) + (float)reference.getWidth() / 2.0f);
	const int coordY1 = (int)((-0.5f * (float)reference.getHeight()	/ 2.0f) + (float)reference.getHeight() / 2.0f);
	const int coordX2 = (int)(( 0.5f * (float)reference.getWidth()	/ 2.0f) + (float)reference.getWidth() / 2.0f);
	const int coordY2 = (int)(( 0.5f * (float)reference.getHeight()	/ 2.0f) + (float)reference.getHeight() / 2.0f);

	for (int x = 0; x < reference.getWidth(); x++)
	{
		if (x < coordX1 || x > coordX2)
			continue;

		for (int y = 0; y < reference.getHeight(); y++)
		{
			if (y >= coordY1 && y <= coordY2)
				reference.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f), x, y);
		}
	}
}